

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall glslang::HlslParseContext::paramFix(HlslParseContext *this,TType *type)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  TQualifier *pTVar3;
  long lVar4;
  void *__dest;
  undefined1 local_68 [8];
  TQualifier bufferQualifier;
  TType *type_local;
  HlslParseContext *this_local;
  
  bufferQualifier._72_8_ = type;
  iVar1 = (*type->_vptr_TType[10])();
  uVar2 = *(uint *)(CONCAT44(extraout_var,iVar1) + 8) & 0x7f;
  if (uVar2 < 2) {
    lVar4 = (**(code **)(*(long *)bufferQualifier._72_8_ + 0x50))();
    *(ulong *)(lVar4 + 8) = *(ulong *)(lVar4 + 8) & 0xffffffffffffff80 | 0x10;
  }
  else if (uVar2 == 2) {
    lVar4 = (**(code **)(*(long *)bufferQualifier._72_8_ + 0x50))();
    *(ulong *)(lVar4 + 8) = *(ulong *)(lVar4 + 8) & 0xffffffffffffff80 | 0x13;
  }
  else if (uVar2 == 6) {
    pTVar3 = (TQualifier *)(**(code **)(*(long *)bufferQualifier._72_8_ + 0x50))();
    correctUniform(this,pTVar3);
    memcpy(local_68,&this->globalBufferDefaults,0x50);
    pTVar3 = (TQualifier *)(**(code **)(*(long *)bufferQualifier._72_8_ + 0x50))();
    mergeObjectLayoutQualifiers(this,(TQualifier *)local_68,pTVar3,true);
    lVar4 = (**(code **)(*(long *)bufferQualifier._72_8_ + 0x50))();
    bufferQualifier.semanticName =
         (char *)((ulong)bufferQualifier.semanticName & 0xffffffffffffff80 |
                 (ulong)((uint)*(undefined8 *)(lVar4 + 8) & 0x7f));
    lVar4 = (**(code **)(*(long *)bufferQualifier._72_8_ + 0x50))();
    bufferQualifier.semanticName =
         (char *)((ulong)bufferQualifier.semanticName & 0xffff7fffffffffff |
                 (ulong)((byte)(*(ulong *)(lVar4 + 8) >> 0x2f) & 1) << 0x2f);
    lVar4 = (**(code **)(*(long *)bufferQualifier._72_8_ + 0x50))();
    bufferQualifier.semanticName =
         (char *)((ulong)bufferQualifier.semanticName & 0xfffdffffffffffff |
                 (ulong)((byte)(*(ulong *)(lVar4 + 8) >> 0x31) & 1) << 0x31);
    lVar4 = (**(code **)(*(long *)bufferQualifier._72_8_ + 0x50))();
    bufferQualifier.semanticName =
         (char *)((ulong)bufferQualifier.semanticName & 0xfffffffffe00ffff |
                 (ulong)((uint)((ulong)*(undefined8 *)(lVar4 + 8) >> 0x10) & 0x1ff) << 0x10);
    __dest = (void *)(**(code **)(*(long *)bufferQualifier._72_8_ + 0x50))();
    memcpy(__dest,local_68,0x50);
  }
  return;
}

Assistant:

void HlslParseContext::paramFix(TType& type)
{
    switch (type.getQualifier().storage) {
    case EvqConst:
        type.getQualifier().storage = EvqConstReadOnly;
        break;
    case EvqGlobal:
    case EvqTemporary:
        type.getQualifier().storage = EvqIn;
        break;
    case EvqBuffer:
        {
            // SSBO parameter.  These do not go through the declareBlock path since they are fn parameters.
            correctUniform(type.getQualifier());
            TQualifier bufferQualifier = globalBufferDefaults;
            mergeObjectLayoutQualifiers(bufferQualifier, type.getQualifier(), true);
            bufferQualifier.storage = type.getQualifier().storage;
            bufferQualifier.readonly = type.getQualifier().readonly;
            bufferQualifier.coherent = type.getQualifier().coherent;
            bufferQualifier.declaredBuiltIn = type.getQualifier().declaredBuiltIn;
            type.getQualifier() = bufferQualifier;
            break;
        }
    default:
        break;
    }
}